

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlsafe_b64.c
# Opt level: O2

size_t urlsafe_b64_encode_(uchar *src,size_t srcSize,b64_char_t *dest,size_t destLen,uint lineLen,
                          B64_RC *rc)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  long lVar5;
  void *pvVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  b64_char_t *dest_00;
  b64_char_t *pbVar10;
  uchar dummy [3];
  
  if (rc == (B64_RC *)0x0) {
    __assert_fail("(((void*)0) != rc)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                  ,0x84,
                  "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                 );
  }
  *rc = B64_RC_OK;
  sVar8 = ((srcSize + 2) / 3) * 4;
  uVar7 = (ulong)lineLen;
  if (lineLen != 0) {
    uVar9 = (lineLen - 1) + sVar8;
    lVar5 = (uVar9 / uVar7) * 2 + -2;
    if (uVar9 < uVar7) {
      lVar5 = 0;
    }
    sVar8 = sVar8 + lVar5;
  }
  if (dest != (b64_char_t *)0x0) {
    if (destLen < sVar8) {
      *rc = B64_RC_INSUFFICIENT_BUFFER;
      sVar8 = 0;
    }
    else {
      uVar9 = 0;
      dest_00 = dest;
      for (; 2 < srcSize; srcSize = srcSize - 3) {
        bVar1 = *src;
        bVar2 = src[1];
        bVar3 = src[2];
        cVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"[bVar1 >> 2];
        *dest_00 = cVar4;
        pvVar6 = memchr("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_",
                        (int)cVar4,0x41);
        if (pvVar6 == (void *)0x0) {
          __assert_fail("(((void*)0) != strchr(b64_chars, *(p-1)))",
                        "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                        ,0xc1,
                        "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                       );
        }
        if (uVar9 + 1 == uVar7) {
          __assert_fail("(len != lineLen)",
                        "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                        ,0xc3,
                        "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                       );
        }
        cVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"
                [(uint)(bVar2 >> 4) | (bVar1 & 3) << 4];
        dest_00[1] = cVar4;
        pvVar6 = memchr("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_",
                        (int)cVar4,0x41);
        if (pvVar6 == (void *)0x0) {
          __assert_fail("(((void*)0) != strchr(b64_chars, *(p-1)))",
                        "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                        ,0xc6,
                        "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                       );
        }
        if (uVar9 + 2 == uVar7) {
          __assert_fail("(len != lineLen)",
                        "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                        ,200,
                        "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                       );
        }
        cVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"
                [(uint)(bVar3 >> 6) + (bVar2 & 0xf) * 4];
        dest_00[2] = cVar4;
        pvVar6 = memchr("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_",
                        (int)cVar4,0x41);
        if (pvVar6 == (void *)0x0) {
          __assert_fail("(((void*)0) != strchr(b64_chars, *(p-1)))",
                        "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                        ,0xcb,
                        "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                       );
        }
        if (uVar9 + 3 == uVar7) {
          __assert_fail("(len != lineLen)",
                        "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                        ,0xcd,
                        "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                       );
        }
        cVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"[bVar3 & 0x3f];
        dest_00[3] = cVar4;
        pvVar6 = memchr("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_",
                        (int)cVar4,0x41);
        if (pvVar6 == (void *)0x0) {
          __assert_fail("(((void*)0) != strchr(b64_chars, *(p-1)))",
                        "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                        ,0xd0,
                        "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                       );
        }
        pbVar10 = dest_00 + 4;
        uVar9 = uVar9 + 4;
        if (pbVar10 != dest + destLen && uVar9 == uVar7) {
          dest_00[4] = '\r';
          dest_00[5] = '\n';
          pbVar10 = dest_00 + 6;
          uVar9 = 0;
        }
        src = src + 3;
        dest_00 = pbVar10;
      }
      if (srcSize != 0) {
        for (uVar7 = 0; uVar9 = srcSize, srcSize != uVar7; uVar7 = uVar7 + 1) {
          dummy[uVar7] = src[uVar7];
        }
        for (; uVar9 != 3; uVar9 = uVar9 + 1) {
          dummy[uVar9] = '\0';
        }
        urlsafe_b64_encode_(dummy,3,dest_00,0xc,0,rc);
        for (; srcSize != 3; srcSize = srcSize + 1) {
          dest_00[srcSize + 1] = '=';
        }
      }
    }
  }
  return sVar8;
}

Assistant:

size_t urlsafe_b64_encode_(
    unsigned char const*    src
,   size_t                  srcSize
,   b64_char_t* const       dest
,   size_t                  destLen
,   unsigned                lineLen
,   B64_RC*                 rc
)
{
	static const b64_char_t b64_chars[] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_";
    size_t total = ((srcSize + (NUM_PLAIN_DATA_BYTES - 1)) / NUM_PLAIN_DATA_BYTES) * NUM_ENCODED_DATA_BYTES;

    B64_ENFORCE_PRECONDITION(NULL != rc, "pointer to return code may not be NULL");
    *rc = B64_RC_OK;

    if(lineLen > 0)
    {
        size_t numLines = (total + (lineLen - 1)) / lineLen;

        total += 2 * (0 == numLines ? 0u : (numLines - 1));
    }

    if(NULL == dest)
    {
        return total;
    }
    else if(destLen < total)
    {
        *rc = B64_RC_INSUFFICIENT_BUFFER;

        return 0;
    }
    else
    {
        b64_char_t* p   =   dest;
        b64_char_t* end =   dest + destLen;
        size_t      len =   0;

        for(; NUM_PLAIN_DATA_BYTES <= srcSize; srcSize -= NUM_PLAIN_DATA_BYTES)
        {
            b64_char_t characters[NUM_ENCODED_DATA_BYTES];

            /* 
             * 
             * |       0       |       1       |       2       |
             *
             * |               |               |               |
             * |       |       |       |       |       |       |
             * |   |   |   |   |   |   |   |   |   |   |   |   |
             * | | | | | | | | | | | | | | | | | | | | | | | | |
             * 
             * |     0     |     1     |     2     |     3     |
             * 
             */

            /* characters[0] is the 6 left-most bits of src[0] */
            characters[0] = (b64_char_t)((src[0] & 0xfc) >> 2);
            /* characters[0] is the right-most 2 bits of src[0] and the left-most 4 bits of src[1] */
            characters[1] = (b64_char_t)(((src[0] & 0x03) << 4) + ((src[1] & 0xf0) >> 4));
            /* characters[0] is the right-most 4 bits of src[1] and the 2 left-most bits of src[2] */
            characters[2] = (b64_char_t)(((src[1] & 0x0f) << 2) + ((src[2] & 0xc0) >> 6));
            /* characters[3] is the right-most 6 bits of src[2] */
            characters[3] = (b64_char_t)(src[2] & 0x3f);

#ifndef __WATCOMC__
            B64_ENFORCE_ASSUMPTION(characters[0] >= 0 && characters[0] < 64);
            B64_ENFORCE_ASSUMPTION(characters[1] >= 0 && characters[1] < 64);
            B64_ENFORCE_ASSUMPTION(characters[2] >= 0 && characters[2] < 64);
            B64_ENFORCE_ASSUMPTION(characters[3] >= 0 && characters[3] < 64);
#endif /* __WATCOMC__ */

            src += NUM_PLAIN_DATA_BYTES;
            *p++ = b64_chars[(unsigned char)characters[0]];
            B64_ENFORCE_ASSUMPTION(NULL != b64_strchr_(b64_chars, *(p-1)));
            ++len;
            B64_ENFORCE_ASSUMPTION(len != lineLen);

            *p++ = b64_chars[(unsigned char)characters[1]];
            B64_ENFORCE_ASSUMPTION(NULL != b64_strchr_(b64_chars, *(p-1)));
            ++len;
            B64_ENFORCE_ASSUMPTION(len != lineLen);

            *p++ = b64_chars[(unsigned char)characters[2]];
            B64_ENFORCE_ASSUMPTION(NULL != b64_strchr_(b64_chars, *(p-1)));
            ++len;
            B64_ENFORCE_ASSUMPTION(len != lineLen);

            *p++ = b64_chars[(unsigned char)characters[3]];
            B64_ENFORCE_ASSUMPTION(NULL != b64_strchr_(b64_chars, *(p-1)));

            if( ++len == lineLen &&
                p != end)
            {
                *p++ = '\r';
                *p++ = '\n';
                len = 0;
            }
        }

        if(0 != srcSize)
        {
            /* Deal with the overspill, by boosting it up to three bytes (using 0s)
             * and then appending '=' for any missing characters.
             *
             * This is done into a temporary buffer, so we can call ourselves and
             * have the output continue to be written direct to the destination.
             */

            unsigned char   dummy[NUM_PLAIN_DATA_BYTES];
            size_t          i;

            for(i = 0; i != srcSize; ++i)
            {
                dummy[i] = *src++;
            }

            for(; i != NUM_PLAIN_DATA_BYTES; ++i)
            {
                dummy[i] = '\0';
            }

            urlsafe_b64_encode_(&dummy[0], NUM_PLAIN_DATA_BYTES, p, NUM_ENCODED_DATA_BYTES * (1 + 2), 0, rc);

            for(p += 1 + srcSize; srcSize++ != NUM_PLAIN_DATA_BYTES; )
            {
                *p++ = '=';
            }
        }

        return total;
    }
}